

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O0

int ASN1_BIT_STRING_num_bytes(ASN1_BIT_STRING *str,size_t *out)

{
  int iVar1;
  uint8_t local_21;
  int len;
  uint8_t padding_bits;
  size_t *out_local;
  ASN1_BIT_STRING *str_local;
  
  _len = out;
  out_local = (size_t *)str;
  iVar1 = asn1_bit_string_length(str,&local_21);
  if (local_21 == '\0') {
    *_len = (long)iVar1;
  }
  str_local._4_4_ = (uint)(local_21 == '\0');
  return str_local._4_4_;
}

Assistant:

int ASN1_BIT_STRING_num_bytes(const ASN1_BIT_STRING *str, size_t *out) {
  uint8_t padding_bits;
  int len = asn1_bit_string_length(str, &padding_bits);
  if (padding_bits != 0) {
    return 0;
  }
  *out = len;
  return 1;
}